

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeClose(sqlite3_vtab_cursor *cur)

{
  Rtree *pRtree;
  long lVar1;
  
  pRtree = (Rtree *)cur->pVtab;
  freeCursorConstraints((RtreeCursor *)cur);
  sqlite3_finalize((sqlite3_stmt *)cur[7].pVtab);
  sqlite3_free(cur[6].pVtab);
  lVar1 = 0xb;
  do {
    nodeRelease(pRtree,(RtreeNode *)cur[lVar1].pVtab);
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x10);
  sqlite3_free(cur);
  pRtree->nCursor = pRtree->nCursor - 1;
  nodeBlobReset(pRtree);
  return 0;
}

Assistant:

static int rtreeClose(sqlite3_vtab_cursor *cur){
  Rtree *pRtree = (Rtree *)(cur->pVtab);
  int ii;
  RtreeCursor *pCsr = (RtreeCursor *)cur;
  assert( pRtree->nCursor>0 );
  freeCursorConstraints(pCsr);
  sqlite3_finalize(pCsr->pReadAux);
  sqlite3_free(pCsr->aPoint);
  for(ii=0; ii<RTREE_CACHE_SZ; ii++) nodeRelease(pRtree, pCsr->aNode[ii]);
  sqlite3_free(pCsr);
  pRtree->nCursor--;
  nodeBlobReset(pRtree);
  return SQLITE_OK;
}